

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

cmpResult __thiscall llvm::detail::IEEEFloat::compareAbsoluteValue(IEEEFloat *this,IEEEFloat *rhs)

{
  bool bVar1;
  uint parts;
  integerPart *lhs;
  integerPart *rhs_00;
  int local_24;
  int compare;
  IEEEFloat *rhs_local;
  IEEEFloat *this_local;
  
  if (this->semantics != rhs->semantics) {
    __assert_fail("semantics == rhs.semantics",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x4a8,
                  "IEEEFloat::cmpResult llvm::detail::IEEEFloat::compareAbsoluteValue(const IEEEFloat &) const"
                 );
  }
  bVar1 = isFiniteNonZero(this);
  if (!bVar1) {
    __assert_fail("isFiniteNonZero()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x4a9,
                  "IEEEFloat::cmpResult llvm::detail::IEEEFloat::compareAbsoluteValue(const IEEEFloat &) const"
                 );
  }
  bVar1 = isFiniteNonZero(rhs);
  if (!bVar1) {
    __assert_fail("rhs.isFiniteNonZero()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x4aa,
                  "IEEEFloat::cmpResult llvm::detail::IEEEFloat::compareAbsoluteValue(const IEEEFloat &) const"
                 );
  }
  local_24 = (int)this->exponent - (int)rhs->exponent;
  if (local_24 == 0) {
    lhs = significandParts(this);
    rhs_00 = significandParts(rhs);
    parts = partCount(this);
    local_24 = APInt::tcCompare(lhs,rhs_00,parts);
  }
  if (local_24 < 1) {
    if (local_24 < 0) {
      this_local._4_4_ = cmpLessThan;
    }
    else {
      this_local._4_4_ = cmpEqual;
    }
  }
  else {
    this_local._4_4_ = cmpGreaterThan;
  }
  return this_local._4_4_;
}

Assistant:

IEEEFloat::cmpResult
IEEEFloat::compareAbsoluteValue(const IEEEFloat &rhs) const {
  int compare;

  assert(semantics == rhs.semantics);
  assert(isFiniteNonZero());
  assert(rhs.isFiniteNonZero());

  compare = exponent - rhs.exponent;

  /* If exponents are equal, do an unsigned bignum comparison of the
     significands.  */
  if (compare == 0)
    compare = APInt::tcCompare(significandParts(), rhs.significandParts(),
                               partCount());

  if (compare > 0)
    return cmpGreaterThan;
  else if (compare < 0)
    return cmpLessThan;
  else
    return cmpEqual;
}